

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end,int server_preference)

{
  uint8_t **ppuVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  size_t i;
  uint16_t id;
  int ret;
  size_t found_index;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t **in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  short in_stack_ffffffffffffffca;
  undefined4 in_stack_ffffffffffffffcc;
  uint8_t **local_30;
  
  local_30 = (uint8_t **)0xffffffffffffffff;
  do {
    if (in_RDX == in_RCX) {
      if (local_30 == (uint8_t **)0xffffffffffffffff) {
        iVar2 = 0x28;
      }
      else {
        *in_RDI = *(undefined8 *)(in_RSI + (long)local_30 * 8);
        iVar2 = 0;
      }
      return iVar2;
    }
    iVar2 = ptls_decode16((uint16_t *)
                          CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8)),
                          in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (iVar2 != 0) {
      return iVar2;
    }
    for (in_stack_ffffffffffffffc0 = (uint8_t **)0x0; ppuVar1 = local_30,
        *(long *)(in_RSI + (long)in_stack_ffffffffffffffc0 * 8) != 0;
        in_stack_ffffffffffffffc0 = (uint8_t **)((long)in_stack_ffffffffffffffc0 + 1)) {
      if (**(short **)(in_RSI + (long)in_stack_ffffffffffffffc0 * 8) == in_stack_ffffffffffffffca) {
        if (in_R8D == 0) {
          *in_RDI = *(undefined8 *)(in_RSI + (long)in_stack_ffffffffffffffc0 * 8);
          return 0;
        }
        ppuVar1 = in_stack_ffffffffffffffc0;
        if (in_stack_ffffffffffffffc0 < local_30) break;
      }
    }
    local_30 = ppuVar1;
    in_stack_ffffffffffffffcc = 0;
  } while( true );
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end, int server_preference)
{
    size_t found_index = SIZE_MAX;
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        for (size_t i = 0; candidates[i] != NULL; ++i) {
            if (candidates[i]->id == id) {
                if (server_preference) {
                    /* preserve smallest matching index, and proceed to the next input */
                    if (i < found_index) {
                        found_index = i;
                        break;
                    }
                } else {
                    /* return the pointer matching to the first input that can be used */
                    *selected = candidates[i];
                    goto Exit;
                }
            }
        }
    }
    if (found_index != SIZE_MAX) {
        *selected = candidates[found_index];
        ret = 0;
    } else {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
    }

Exit:
    return ret;
}